

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool dummy [3];
  bool at_end;
  bool local_39;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffffc8;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffffd0;
  ParamIterator<libaom_test::TestMode> *this_00;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
              *)0x7ad543);
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
              *)0x7ad556);
  local_b._2_1_ =
       ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                 (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (ParamIterator<libaom_test::TestMode> *)&local_b;
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    in_stack_ffffffffffffffc8 =
         (ParamIterator<const_libaom_test::CodecFactory_*> *)
         std::
         get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                   ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                     *)0x7ad5a3);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ad5b6);
    local_21 = ParamIterator<libaom_test::TestMode>::operator==
                         (this_00,(ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffffc8)
    ;
  }
  local_b._2_1_ = local_21;
  *(bool *)&(this_00->impl_)._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
            ._M_head_impl = local_21;
  local_39 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ad607);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ad61a);
    local_39 = ParamIterator<unsigned_int>::operator==
                         ((ParamIterator<unsigned_int> *)this_00,
                          (ParamIterator<unsigned_int> *)in_stack_ffffffffffffffc8);
  }
  return local_39;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }